

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * mi_arena_static_zalloc(size_t size,size_t alignment,mi_memid_t *memid)

{
  size_t sz;
  long lVar1;
  uintptr_t uVar2;
  undefined8 *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  uint8_t *p;
  size_t start;
  size_t top;
  size_t oldtop;
  size_t oversize;
  size_t toplow;
  undefined8 *n;
  undefined4 in_stack_ffffffffffffff40;
  mi_memkind_t in_stack_ffffffffffffff44;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  size_t local_18;
  uint8_t *local_8;
  
  _mi_memid_none();
  *in_RDX = local_38;
  in_RDX[1] = local_30;
  in_RDX[2] = local_28;
  sz = mi_arena_static_top;
  if ((in_RDI == 0) || (0x1000 < in_RDI)) {
    local_8 = (uint8_t *)0x0;
  }
  else if (mi_arena_static_top + in_RDI < 0x1001) {
    local_18 = in_RSI;
    if (in_RSI < 0x10) {
      local_18 = 0x10;
    }
    lVar1 = in_RDI + local_18 + -1;
    if (mi_arena_static_top + lVar1 < 0x1001) {
      LOCK();
      UNLOCK();
      if (mi_arena_static_top + lVar1 < 0x1001) {
        mi_arena_static_top = mi_arena_static_top + lVar1;
        n = in_RDX;
        _mi_memid_create(in_stack_ffffffffffffff44);
        *n = local_98;
        n[1] = local_90;
        n[2] = local_88;
        *(undefined1 *)((long)in_RDX + 0x12) = 1;
        uVar2 = _mi_align_up(sz,local_18);
        local_8 = mi_arena_static + uVar2;
        _mi_memzero_aligned((void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (size_t)n);
      }
      else {
        LOCK();
        UNLOCK();
        local_8 = (uint8_t *)0x0;
      }
    }
    else {
      local_8 = (uint8_t *)0x0;
    }
  }
  else {
    local_8 = (uint8_t *)0x0;
  }
  return local_8;
}

Assistant:

static void* mi_arena_static_zalloc(size_t size, size_t alignment, mi_memid_t* memid) {
  *memid = _mi_memid_none();
  if (size == 0 || size > MI_ARENA_STATIC_MAX) return NULL;
  const size_t toplow = mi_atomic_load_relaxed(&mi_arena_static_top);
  if ((toplow + size) > MI_ARENA_STATIC_MAX) return NULL;

  // try to claim space
  if (alignment < MI_MAX_ALIGN_SIZE) { alignment = MI_MAX_ALIGN_SIZE; }
  const size_t oversize = size + alignment - 1;
  if (toplow + oversize > MI_ARENA_STATIC_MAX) return NULL;
  const size_t oldtop = mi_atomic_add_acq_rel(&mi_arena_static_top, oversize);
  size_t top = oldtop + oversize;
  if (top > MI_ARENA_STATIC_MAX) {
    // try to roll back, ok if this fails
    mi_atomic_cas_strong_acq_rel(&mi_arena_static_top, &top, oldtop);
    return NULL;
  }

  // success
  *memid = _mi_memid_create(MI_MEM_STATIC);
  memid->initially_zero = true;
  const size_t start = _mi_align_up(oldtop, alignment);
  uint8_t* const p = &mi_arena_static[start];
  _mi_memzero_aligned(p, size);
  return p;
}